

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O0

void aes_ni_setkey(ssh_cipher *ciph,void *vkey)

{
  uchar *key;
  aes_ni_context *ctx;
  void *vkey_local;
  ssh_cipher *ciph_local;
  
  aes_ni_key_expand((uchar *)vkey,(long)(ciph->vt->real_keybits / 0x20),(__m128i *)(ciph + -0x3f),
                    (__m128i *)(ciph + -0x21));
  return;
}

Assistant:

static void aes_ni_setkey(ssh_cipher *ciph, const void *vkey)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);
    const unsigned char *key = (const unsigned char *)vkey;

    aes_ni_key_expand(key, ctx->ciph.vt->real_keybits / 32,
                      ctx->keysched_e, ctx->keysched_d);
}